

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator)

{
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  UnknownField *this_00;
  protobuf *this_01;
  uint64 uVar5;
  string *data;
  UnknownFieldSet *unknown_fields_00;
  uint *dest;
  int i;
  unsigned_long i_00;
  AlphaNum *a;
  AlphaNum *a_00;
  int index;
  char *pcVar6;
  Hex hex;
  Hex hex_00;
  StringPiece src;
  allocator local_b9;
  Printer *local_b8;
  UnknownFieldSet embedded_unknown_fields;
  StringPiece local_90;
  string printed;
  string field_number;
  
  index = 0;
  local_b8 = this;
  do {
    pvVar1 = unknown_fields->fields_;
    iVar3 = 0;
    if (pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      iVar3 = (int)((ulong)((long)(pvVar1->
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar1->
                                 super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 4);
    }
    if (iVar3 <= index) {
      return;
    }
    this_00 = UnknownFieldSet::field(unknown_fields,index);
    SimpleItoa_abi_cxx11_(&field_number,(protobuf *)(ulong)this_00->number_,i);
    dest = &switchD_00603cf9::switchdataD_0065ef3c;
    switch(this_00->type_) {
    case 0:
      TextGenerator::Print(generator,&field_number);
      TextGenerator::Print(generator,": ");
      this_01 = (protobuf *)UnknownField::varint(this_00);
      SimpleItoa_abi_cxx11_(&printed,this_01,i_00);
      TextGenerator::Print(generator,&printed);
      std::__cxx11::string::~string((string *)&printed);
      goto LAB_00603e7b;
    case 1:
      TextGenerator::Print(generator,&field_number);
      TextGenerator::Print(generator,": 0x");
      uVar4 = UnknownField::fixed32(this_00);
      hex_00.value = (ulong)uVar4;
      hex_00._8_8_ = 8;
      strings::AlphaNum::AlphaNum((AlphaNum *)&printed,hex_00);
      StrCat_abi_cxx11_((string *)&embedded_unknown_fields,(protobuf *)&printed,a_00);
      TextGenerator::Print(generator,(string *)&embedded_unknown_fields);
      goto LAB_00603e6e;
    case 2:
      TextGenerator::Print(generator,&field_number);
      TextGenerator::Print(generator,": 0x");
      uVar5 = UnknownField::fixed64(this_00);
      hex._8_8_ = 0x10;
      hex.value = uVar5;
      strings::AlphaNum::AlphaNum((AlphaNum *)&printed,hex);
      StrCat_abi_cxx11_((string *)&embedded_unknown_fields,(protobuf *)&printed,a);
      TextGenerator::Print(generator,(string *)&embedded_unknown_fields);
LAB_00603e6e:
      std::__cxx11::string::~string((string *)&embedded_unknown_fields);
      this = local_b8;
LAB_00603e7b:
      pcVar6 = "\n";
      if (this->single_line_mode_ != false) {
        pcVar6 = " ";
      }
LAB_00603e92:
      TextGenerator::Print(generator,pcVar6);
      break;
    case 3:
      TextGenerator::Print(generator,&field_number);
      data = UnknownField::length_delimited_abi_cxx11_(this_00);
      embedded_unknown_fields.fields_ =
           (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            *)0x0;
      if ((data->_M_string_length == 0) ||
         (bVar2 = UnknownFieldSet::ParseFromString(&embedded_unknown_fields,data), !bVar2)) {
        std::__cxx11::string::string((string *)&printed,": \"",&local_b9);
        StringPiece::StringPiece<std::allocator<char>>(&local_90,data);
        src.length_ = (stringpiece_ssize_type)&printed;
        src.ptr_ = (char *)local_90.length_;
        CEscapeAndAppend((protobuf *)local_90.ptr_,src,(string *)dest);
        std::__cxx11::string::append((char *)&printed);
        TextGenerator::Print(generator,&printed);
        std::__cxx11::string::~string((string *)&printed);
      }
      else {
        if (this->single_line_mode_ == true) {
          TextGenerator::Print(generator," { ");
        }
        else {
          TextGenerator::Print(generator," {\n");
          TextGenerator::Indent(generator);
        }
        PrintUnknownFields(this,&embedded_unknown_fields,generator);
        pcVar6 = "} ";
        if (this->single_line_mode_ == false) {
          TextGenerator::Outdent(generator);
          pcVar6 = "}\n";
        }
        TextGenerator::Print(generator,pcVar6);
      }
      UnknownFieldSet::~UnknownFieldSet(&embedded_unknown_fields);
      break;
    case 4:
      TextGenerator::Print(generator,&field_number);
      if (this->single_line_mode_ == true) {
        TextGenerator::Print(generator," { ");
      }
      else {
        TextGenerator::Print(generator," {\n");
        TextGenerator::Indent(generator);
      }
      unknown_fields_00 = UnknownField::group(this_00);
      PrintUnknownFields(this,unknown_fields_00,generator);
      pcVar6 = "} ";
      if (this->single_line_mode_ == false) {
        TextGenerator::Outdent(generator);
        pcVar6 = "}\n";
      }
      goto LAB_00603e92;
    }
    std::__cxx11::string::~string((string *)&field_number);
    index = index + 1;
  } while( true );
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator& generator) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    string field_number = SimpleItoa(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator.Print(field_number);
        generator.Print(": ");
        generator.Print(SimpleItoa(field.varint()));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator.Print(field_number);
        generator.Print(": 0x");
        generator.Print(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator.Print(" ");
        } else {
          generator.Print("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator.Print(field_number);
        const string& value = field.length_delimited();
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && embedded_unknown_fields.ParseFromString(value)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator.Print(" { ");
          } else {
            generator.Print(" {\n");
            generator.Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator);
          if (single_line_mode_) {
            generator.Print("} ");
          } else {
            generator.Outdent();
            generator.Print("}\n");
          }
        } else {
          // This field is not parseable as a Message.
          // So it is probably just a plain string.
          string printed(": \"");
          CEscapeAndAppend(value, &printed);
          printed.append(single_line_mode_ ? "\" " : "\"\n");
          generator.Print(printed);
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator.Print(field_number);
        if (single_line_mode_) {
          generator.Print(" { ");
        } else {
          generator.Print(" {\n");
          generator.Indent();
        }
        PrintUnknownFields(field.group(), generator);
        if (single_line_mode_) {
          generator.Print("} ");
        } else {
          generator.Outdent();
          generator.Print("}\n");
        }
        break;
    }
  }
}